

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O0

void sanitize_player_loc(chunk *c,player *p)

{
  loc_conflict grid;
  loc_conflict grid_00;
  _Bool _Var1;
  uint32_t uVar2;
  int x;
  int y;
  uint32_t uVar3;
  loc_conflict lVar4;
  int local_34;
  wchar_t local_30;
  wchar_t try;
  wchar_t vy;
  wchar_t vx;
  wchar_t iy;
  wchar_t ix;
  wchar_t ty;
  wchar_t tx;
  player *p_local;
  chunk *c_local;
  
  lVar4.x = (p->grid).x;
  lVar4.y = (p->grid).y;
  _Var1 = square_in_bounds_fully(c,lVar4);
  if (((_Var1) &&
      (grid.x = (p->grid).x, grid.y = (p->grid).y, _Var1 = square_isarrivable(c,grid), _Var1)) &&
     (grid_00.x = (p->grid).x, grid_00.y = (p->grid).y, _Var1 = square_isvault(c,grid_00), !_Var1))
  {
    return;
  }
  try = L'\x01';
  local_30 = L'\x01';
  local_34 = 1000;
  do {
    do {
      if (local_34 == 0) {
        uVar2 = Rand_div(c->width + L'\xffffffff');
        uVar3 = Rand_div(c->height + L'\xffffffff');
        ix = uVar2 + L'\x02';
        iy = uVar3 + L'\x01';
        if (c->width + L'\xffffffff' <= ix) {
          ix = L'\x01';
          iy = uVar3 + L'\x02';
          if (c->height + L'\xffffffff' <= iy) {
            iy = L'\x01';
          }
        }
        while( true ) {
          lVar4 = (loc_conflict)loc(ix,iy);
          _Var1 = square_isempty(c,lVar4);
          if (_Var1) {
            lVar4 = (loc_conflict)loc(ix,iy);
            _Var1 = square_isvault(c,lVar4);
            if (!_Var1) {
              (p->grid).y = iy;
              (p->grid).x = ix;
              return;
            }
            local_30 = iy;
            try = ix;
          }
          if ((ix == uVar2 + L'\x01') && (iy == uVar3 + L'\x01')) break;
          ix = ix + L'\x01';
          if (c->width + L'\xffffffff' <= ix) {
            ix = L'\x01';
            iy = iy + L'\x01';
            if (c->height + L'\xffffffff' <= iy) {
              iy = L'\x01';
            }
          }
        }
        (p->grid).x = try;
        (p->grid).y = local_30;
        return;
      }
      local_34 = local_34 + -1;
      uVar2 = Rand_div(c->width + L'\xffffffff');
      x = uVar2 + 1;
      uVar2 = Rand_div(c->height + L'\xffffffff');
      y = uVar2 + 1;
      lVar4 = (loc_conflict)loc(x,y);
      _Var1 = square_isempty(c,lVar4);
    } while (!_Var1);
    lVar4 = (loc_conflict)loc(x,y);
    _Var1 = square_isvault(c,lVar4);
  } while (_Var1);
  (p->grid).y = y;
  (p->grid).x = x;
  return;
}

Assistant:

static void sanitize_player_loc(struct chunk *c, struct player *p)
{
	/* TODO potential problem: stairs in vaults? */

	/* allow direct transfer if target location is teleportable */
	if (square_in_bounds_fully(c, p->grid)
		&& square_isarrivable(c, p->grid)
		&& !square_isvault(c, p->grid)) {
		return;
	}

	/* TODO should use something similar to teleport code, but this will
	 *  do for now as a quick'n dirty fix
	 */
	int tx, ty; // test locations
	int ix, iy; // initial location
	int vx = 1, vy = 1; // fallback vault location
	int try = 1000; // attempts

	/* a bunch of random locations */
	while (try) {
		try = try - 1;
		tx = randint0(c->width - 1) + 1;
		ty = randint0(c->height - 1) + 1;
		if (square_isempty(c, loc(tx, ty))
			&& !square_isvault(c, loc(tx, ty))) {
			p->grid.y = ty;
			p->grid.x = tx;
			return;
		}
	}

	/* whelp, that didnt work */
	ix = randint0(c->width - 1) + 1;
	iy = randint0(c->height - 1) + 1;
	ty = iy;
	tx = ix + 1;
	if (tx >= c->width - 1) {
		tx = 1;
		ty = ty + 1;
		if (ty >= c->height -1) {
			ty = 1;
		}
	}

	while (1) {		//until full loop through dungeon
		if (square_isempty(c, loc(tx, ty))) {
			if (!square_isvault(c, loc(tx, ty))) {
				// ok location
				p->grid.y = ty;
				p->grid.x = tx;
				return;
			}
			// vault, but lets remember it just in case
			vy = ty;
			vx = tx;
		}
		// oops tried *every* tile...
		if (tx == ix && ty == iy) {
			break;
		}
		tx = tx + 1;
		if (tx >= c->width - 1) {
			tx = 1;
			ty = ty + 1;
			if (ty >= c->height -1) {
				ty = 1;
			}
		}
	}

	// fallback vault location (or at least a non-crashy square)
	p->grid.x = vx;
	p->grid.y = vy;
}